

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_solvers_4x5::test_method(test_solvers_4x5 *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  local_100;
  unsigned_long uStack_d8;
  size_t expected_assignment [4];
  double costs [20];
  test_solvers_4x5 *this_local;
  
  memcpy(expected_assignment + 3,&DAT_00140b00,0xa0);
  expected_assignment[1] = 3;
  expected_assignment[2] = 4;
  uStack_d8 = 0;
  expected_assignment[0] = 2;
  make_matrix<double>(&local_100,(double *)(expected_assignment + 3),4,5);
  make_vector<unsigned_long>(&local_118,&uStack_d8,4);
  assert_solvers_result<double>(&local_100,31.0,&local_118);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_118);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::~matrix(&local_100);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_4x5)
{
  const double costs[] = {10, 19, 8, 15, 0,
                          10, 18, 7, 17, 0,
                          13, 16, 9, 14, 0,
                          12, 19, 8, 18, 0};
  const std::size_t expected_assignment[] = {0, 2, 3, 4};
  assert_solvers_result(make_matrix(costs, 4, 5), 31.0, make_vector(expected_assignment, 4));
}